

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

StructNew * __thiscall
wasm::Builder::makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Module *pMVar1;
  StructNew *pSVar2;
  
  pMVar1 = this->wasm;
  pSVar2 = (StructNew *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x200),0x30,8);
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id = StructNewId;
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = 0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pSVar2->operands).allocator = (MixedArena *)(pMVar1 + 0x200);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pSVar2->operands,
             args);
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = type.id;
    wasm::StructNew::finalize();
    return pSVar2;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }